

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O2

Sfm_Ntk_t * Abc_NtkExtractMfs(Abc_Ntk_t *pNtk,int nFirstFixed)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *vNodes;
  Vec_Wec_t *vFanins;
  Vec_Str_t *pVVar3;
  long lVar4;
  long *plVar5;
  word Entry;
  word *pRes;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  Abc_Obj_t *pAVar8;
  Sfm_Ntk_t *pSVar9;
  ulong uVar10;
  ulong uVar11;
  undefined8 extraout_RDX;
  undefined8 uVar12;
  undefined8 extraout_RDX_00;
  int iVar13;
  word (*TruthStore_00) [1024];
  uint uVar14;
  int nTotal;
  Vec_Wrd_t *pVStack_220e0;
  Vec_Int_t *pVStack_220d8;
  Vec_Wrd_t *pVStack_220d0;
  Vec_Str_t *pVStack_220c8;
  ulong uStack_220c0;
  word *pTruths [16];
  word pCube [1024];
  word TruthStore [16] [1024];
  
  TruthStore_00 = TruthStore;
  memset(TruthStore_00,0,0x20000);
  pTruths[0xe] = (word *)0x0;
  pTruths[0xf] = (word *)0x0;
  pTruths[0xc] = (word *)0x0;
  pTruths[0xd] = (word *)0x0;
  pTruths[10] = (word *)0x0;
  pTruths[0xb] = (word *)0x0;
  pTruths[8] = (word *)0x0;
  pTruths[9] = (word *)0x0;
  pTruths[6] = (word *)0x0;
  pTruths[7] = (word *)0x0;
  pTruths[4] = (word *)0x0;
  pTruths[5] = (word *)0x0;
  pTruths[2] = (word *)0x0;
  pTruths[3] = (word *)0x0;
  pTruths[0] = (word *)0x0;
  pTruths[1] = (word *)0x0;
  memset(pCube,0,0x2000);
  nTotal = 0;
  uStack_220c0 = (ulong)(uint)nFirstFixed;
  if (nFirstFixed == 0) {
    vNodes = Abc_NtkAssignIDs(pNtk);
  }
  else {
    vNodes = Abc_NtkAssignIDs2(pNtk);
  }
  iVar13 = vNodes->nSize + pNtk->vCis->nSize + pNtk->vCos->nSize;
  vFanins = Vec_WecStart(iVar13);
  pVVar3 = Vec_StrStart(iVar13);
  pVStack_220d0 = Vec_WrdStart(iVar13);
  pVStack_220d8 = Abc_NtkAssignStarts(pNtk,vNodes,&nTotal);
  pVStack_220e0 = Vec_WrdStart(nTotal);
  Abc_NtkFillTruthStore(TruthStore_00);
  for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
    pTruths[lVar4] = *TruthStore_00;
    TruthStore_00 = TruthStore_00 + 1;
  }
  iVar13 = 0;
  pVStack_220c8 = pVVar3;
  do {
    if (vNodes->nSize <= iVar13) {
      for (iVar13 = 0; iVar13 < pNtk->vCos->nSize; iVar13 = iVar13 + 1) {
        pAVar8 = Abc_NtkCo(pNtk,iVar13);
        pVVar7 = Vec_WecEntry(vFanins,(pAVar8->field_6).iTemp);
        Vec_IntGrow(pVVar7,(pAVar8->vFanins).nSize);
        for (lVar4 = 0; lVar4 < (pAVar8->vFanins).nSize; lVar4 = lVar4 + 1) {
          Vec_IntPush(pVVar7,*(int *)((long)pAVar8->pNtk->vObjs->pArray
                                            [(pAVar8->vFanins).pArray[lVar4]] + 0x40));
        }
      }
      Vec_PtrFree(vNodes);
      uVar6 = uStack_220c0;
      pVVar3 = pVStack_220c8;
      iVar13 = pNtk->vCis->nSize;
      uVar12 = extraout_RDX;
      for (iVar2 = iVar13; iVar1 = (int)uVar6, iVar2 < iVar13 + iVar1; iVar2 = iVar2 + 1) {
        Vec_StrWriteEntry(pVVar3,iVar2,(char)uVar12);
        iVar13 = pNtk->vCis->nSize;
        uVar12 = extraout_RDX_00;
      }
      if ((-1 < iVar1) && (iVar1 < pNtk->nObjCounts[7])) {
        pSVar9 = Sfm_NtkConstruct(vFanins,iVar13,pNtk->vCos->nSize,pVVar3,(Vec_Str_t *)0x0,
                                  pVStack_220d0,pVStack_220d8,pVStack_220e0);
        return pSVar9;
      }
      __assert_fail("nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMfs.c"
                    ,0xd2,"Sfm_Ntk_t *Abc_NtkExtractMfs(Abc_Ntk_t *, int)");
    }
    plVar5 = (long *)Vec_PtrEntry(vNodes,iVar13);
    iVar2 = *(int *)((long)plVar5 + 0x1c);
    if (iVar2 < 7) {
      Entry = Abc_SopToTruth((char *)plVar5[7],iVar2);
      Vec_WrdWriteEntry(pVStack_220d0,(int)plVar5[8],Entry);
      if (Entry - 1 < 0xfffffffffffffffe) {
LAB_0029b3d9:
        pVVar7 = Vec_WecEntry(vFanins,(int)plVar5[8]);
        Vec_IntGrow(pVVar7,*(int *)((long)plVar5 + 0x1c));
        for (lVar4 = 0; lVar4 < *(int *)((long)plVar5 + 0x1c); lVar4 = lVar4 + 1) {
          Vec_IntPush(pVVar7,*(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                               (long)*(int *)(plVar5[4] + lVar4 * 4) * 8) + 0x40));
        }
      }
    }
    else {
      uVar14 = 1 << ((char)iVar2 - 6U & 0x1f);
      iVar2 = Vec_IntEntry(pVStack_220d8,(int)plVar5[8]);
      pRes = Vec_WrdEntryP(pVStack_220e0,iVar2);
      Abc_SopToTruthBig((char *)plVar5[7],*(int *)((long)plVar5 + 0x1c),pTruths,pCube,pRes);
      uVar6 = 0;
      if (0 < (int)uVar14) {
        uVar6 = (ulong)uVar14;
      }
      for (uVar10 = 0; (uVar11 = uVar6, uVar6 != uVar10 && (uVar11 = uVar10, pRes[uVar10] == 0));
          uVar10 = uVar10 + 1) {
      }
      if ((uint)uVar11 != uVar14) {
        for (uVar10 = 0; uVar6 != uVar10; uVar10 = uVar10 + 1) {
          if (pRes[uVar10] != 0xffffffffffffffff) {
            uVar6 = uVar10 & 0xffffffff;
            break;
          }
        }
        if ((uint)uVar6 != uVar14) goto LAB_0029b3d9;
      }
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs( Abc_Ntk_t * pNtk, int nFirstFixed )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = nFirstFixed ? Abc_NtkAssignIDs2(pNtk) : Abc_NtkAssignIDs(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdStart( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
        //Vec_IntPrint( vArray );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    for ( i = Abc_NtkCiNum(pNtk); i < Abc_NtkCiNum(pNtk) + nFirstFixed; i++ )
        Vec_StrWriteEntry( vFixed, i, (char)1 );
    // update fixed
    assert( nFirstFixed >= 0 && nFirstFixed < Abc_NtkNodeNum(pNtk) );
//    for ( i = Abc_NtkCiNum(pNtk); i + Abc_NtkCoNum(pNtk) < Abc_NtkObjNum(pNtk); i++ )
//        if ( rand() % 10 == 0 )
//            Vec_StrWriteEntry( vFixed, i, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}